

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O2

void BrotliCompressFragmentFastImpl11
               (BrotliOnePassArena *s,uint8_t *input,size_t input_size,int is_last,int *table,
               size_t *storage_ix,uint8_t *storage)

{
  uint32_t *__dest;
  uint32_t *puVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint16_t *puVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_t j;
  ulong *puVar10;
  ulong uVar11;
  uint32_t *puVar12;
  byte bVar13;
  ulong uVar14;
  uint8_t *puVar15;
  long lVar16;
  BrotliOnePassArena *array;
  uint8_t *puVar17;
  int iVar18;
  ulong uVar19;
  ulong *puVar20;
  long lVar21;
  ulong uVar22;
  uint8_t *puVar23;
  uint8_t *puVar24;
  uint8_t *puVar25;
  long *plVar26;
  ulong uVar27;
  size_t i;
  ulong uVar28;
  long *begin;
  long *plVar29;
  long *plVar30;
  long *data;
  bool bVar31;
  long *local_120;
  uint8_t *local_118;
  ulong local_108;
  size_t local_f8;
  ulong local_e0;
  uint8_t *local_d0;
  
  puVar17 = (uint8_t *)0x18000;
  if (input_size < 0x18000) {
    puVar17 = (uint8_t *)input_size;
  }
  local_f8 = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)puVar17,0,storage_ix,storage);
  uVar28 = *storage_ix;
  uVar14 = uVar28 >> 3;
  *(ulong *)(storage + uVar14) = (ulong)storage[uVar14];
  *storage_ix = uVar28 + 0xd;
  local_e0 = BuildAndStoreLiteralPrefixCode
                       (s,input,(size_t)puVar17,s->lit_depth,s->lit_bits,storage_ix,storage);
  for (uVar28 = 0; uVar14 = s->cmd_code_numbits, uVar28 + 7 < uVar14; uVar28 = uVar28 + 8) {
    uVar14 = *storage_ix;
    *(ulong *)(storage + (uVar14 >> 3)) =
         (ulong)s->cmd_code[uVar28 >> 3] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
    *storage_ix = uVar14 + 8;
  }
  __dest = s->cmd_histo;
  uVar28 = *storage_ix;
  *(ulong *)(storage + (uVar28 >> 3)) =
       (ulong)s->cmd_code[uVar14 >> 3] << ((byte)uVar28 & 7) | (ulong)storage[uVar28 >> 3];
  *storage_ix = ((uint)uVar14 & 7) + uVar28;
  puVar1 = s->cmd_histo + 0x40;
  begin = (long *)input;
  local_118 = (uint8_t *)input_size;
LAB_00357aba:
  plVar29 = begin;
  local_120 = begin;
  local_d0 = puVar17;
  do {
    switchD_0036ec8a::default(__dest,kCmdHistoSeed,0x200);
    data = (long *)((long)plVar29 + (long)local_d0);
    if ((uint8_t *)0xf < local_d0) {
      puVar15 = local_118 + -0x10;
      if (local_d0 + -5 < local_118 + -0x10) {
        puVar15 = local_d0 + -5;
      }
      local_108 = 0xffffffff;
      plVar30 = plVar29;
LAB_00357b56:
      lVar16 = *(long *)((long)plVar30 + 1);
      uVar28 = 0x20;
      plVar30 = (long *)((long)plVar30 + 1);
      do {
        plVar26 = (long *)((uVar28 >> 5) + (long)plVar30);
        if (puVar15 + (long)plVar29 < plVar26) break;
        uVar14 = (ulong)(lVar16 * 0x1e35a7bd000000) >> 0x35;
        lVar16 = *plVar26;
        iVar8 = (int)input;
        if ((((int)*plVar30 == *(int *)((long)plVar30 + -(long)(int)local_108)) &&
            (puVar24 = (uint8_t *)((long)plVar30 + -(long)(int)local_108),
            *(uint8_t *)((long)plVar30 + 4) == puVar24[4])) && (0 < (int)local_108)) {
          table[uVar14] = (int)plVar30 - iVar8;
LAB_00357bb5:
          uVar14 = (long)plVar30 - (long)puVar24;
          if ((long)uVar14 < 0x3fff1) goto LAB_00357bf8;
        }
        else {
          iVar5 = table[uVar14];
          table[uVar14] = (int)plVar30 - iVar8;
          if (((int)*plVar30 == *(int *)(input + iVar5)) &&
             (puVar24 = input + iVar5, *(uint8_t *)((long)plVar30 + 4) == puVar24[4]))
          goto LAB_00357bb5;
        }
        uVar28 = (ulong)((int)uVar28 + 1);
        plVar30 = plVar26;
      } while( true );
    }
LAB_00358833:
    local_118 = local_118 + -(long)local_d0;
    local_d0 = (uint8_t *)0x10000;
    if (local_118 < (uint8_t *)0x10000) {
      local_d0 = local_118;
    }
    if (((local_118 == (uint8_t *)0x0) ||
        (puVar17 = puVar17 + (long)local_d0, "\x7fELF\x02\x01\x01" < puVar17)) ||
       (array = s, iVar8 = ShouldMergeBlock(s,(uint8_t *)data,(size_t)local_d0,s->lit_depth),
       iVar8 == 0)) goto LAB_003588a1;
    UpdateBits((ulong)((int)puVar17 - 1),(int)local_f8 + 3,(size_t)storage,array->lit_depth);
    plVar29 = data;
  } while( true );
LAB_00357bf8:
  puVar10 = (ulong *)(puVar24 + 5);
  puVar20 = (ulong *)((long)plVar30 + 5);
  puVar24 = (uint8_t *)((long)data + (-5 - (long)plVar30));
  lVar16 = 0;
LAB_00357c0e:
  if (puVar24 < (uint8_t *)0x8) {
    for (puVar25 = (uint8_t *)0x0;
        (puVar24 != puVar25 &&
        (*(uint8_t *)((long)puVar10 + (long)puVar25) == *(uint8_t *)((long)puVar20 + (long)puVar25))
        ); puVar25 = puVar25 + 1) {
    }
  }
  else {
    if (*puVar20 == *puVar10) goto code_r0x00357c1f;
    uVar27 = *puVar10 ^ *puVar20;
    uVar28 = 0;
    if (uVar27 != 0) {
      for (; (uVar27 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
      }
    }
    puVar25 = (uint8_t *)(uVar28 >> 3 & 0x1fffffff);
  }
  lVar16 = (long)puVar25 - lVar16;
  uVar28 = (long)plVar30 - (long)local_120;
  if (uVar28 < 0x1842) {
    if (uVar28 < 6) {
      bVar3 = *(byte *)((long)s + uVar28 + 0x328);
      uVar27 = *storage_ix;
      *(ulong *)(storage + (uVar27 >> 3)) =
           (ulong)*(ushort *)((long)s + uVar28 * 2 + 0x3d0) << ((byte)uVar27 & 7) |
           (ulong)storage[uVar27 >> 3];
      *storage_ix = bVar3 + uVar27;
      puVar12 = __dest + uVar28 + 0x28;
    }
    else if (uVar28 < 0x82) {
      uVar27 = uVar28 - 2;
      uVar9 = 0x1f;
      if ((uint)uVar27 != 0) {
        for (; (uint)uVar27 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
      uVar22 = uVar27 >> ((byte)uVar9 & 0x3f);
      lVar21 = uVar22 + (ulong)uVar9 * 2;
      uVar11 = *storage_ix;
      uVar19 = *(byte *)((long)s->cmd_bits + lVar21 + -0x56) + uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)s->cmd_bits[lVar21 + 0x2a] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           uVar27 - (uVar22 << ((byte)uVar9 & 0x3f)) << ((byte)uVar19 & 7) |
           (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar19 + uVar9;
      puVar12 = __dest + lVar21 + 0x2a;
    }
    else if (uVar28 < 0x842) {
      uVar7 = (int)uVar28 - 0x42;
      uVar9 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      lVar21 = -(ulong)(uVar9 ^ 0x1f) + 0x51;
      uVar27 = *storage_ix;
      uVar11 = *(byte *)((long)s + -(ulong)(uVar9 ^ 0x1f) + 0x351) + uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           (ulong)*(ushort *)((long)s + lVar21 * 2 + 0x380) << ((byte)uVar27 & 7) |
           (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (-1L << ((byte)uVar9 & 0x3f)) + uVar28 + -0x42 << ((byte)uVar11 & 7) |
           (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar9 + uVar11;
      puVar12 = __dest + lVar21;
    }
    else {
      bVar3 = s->cmd_depth[0x3d];
      uVar11 = *storage_ix;
      uVar27 = uVar11 + bVar3;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)s->cmd_bits[0x3d] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           uVar28 - 0x842 << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar11 + bVar3 + 0xc;
      puVar12 = s->cmd_histo + 0x3d;
    }
  }
  else {
    uVar27 = ((long)local_120 - (long)begin) * 0x32;
    if ((uVar27 < uVar28 || uVar27 - uVar28 == 0) && (0x3d4 < local_e0)) {
      EmitUncompressedMetaBlock((uint8_t *)begin,(uint8_t *)plVar30,local_f8,storage_ix,storage);
      local_118 = (uint8_t *)((long)plVar29 + ((long)local_118 - (long)plVar30));
      data = plVar30;
      goto LAB_00358c76;
    }
    if (uVar28 < 0x5842) {
      uVar22 = (ulong)s->cmd_depth[0x3e];
      uVar11 = *storage_ix;
      uVar27 = uVar11 + uVar22;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)s->cmd_bits[0x3e] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           uVar28 - 0x1842 << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar11 + uVar22 + 0xe;
      puVar12 = s->cmd_histo + 0x3e;
    }
    else {
      uVar22 = (ulong)s->cmd_depth[0x3f];
      uVar11 = *storage_ix;
      uVar27 = uVar11 + uVar22;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)s->cmd_bits[0x3f] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           uVar28 - 0x5842 << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar11 + uVar22 + 0x18;
      puVar12 = s->cmd_histo + 0x3f;
    }
  }
  uVar27 = lVar16 + 5;
  *puVar12 = *puVar12 + 1;
  for (uVar11 = 0; uVar28 != uVar11; uVar11 = uVar11 + 1) {
    bVar3 = s->lit_depth[*(byte *)((long)local_120 + uVar11)];
    uVar22 = *storage_ix;
    *(ulong *)(storage + (uVar22 >> 3)) =
         (ulong)s->lit_bits[*(byte *)((long)local_120 + uVar11)] << ((byte)uVar22 & 7) |
         (ulong)storage[uVar22 >> 3];
    *storage_ix = bVar3 + uVar22;
  }
  if ((int)local_108 == (int)uVar14) {
    uVar28 = *storage_ix;
    uVar11 = s->cmd_depth[0x40] + uVar28;
    *(ulong *)(storage + (uVar28 >> 3)) =
         (ulong)s->cmd_bits[0x40] << ((byte)uVar28 & 7) | (ulong)storage[uVar28 >> 3];
    puVar12 = puVar1;
  }
  else {
    uVar28 = (long)(int)uVar14 + 3;
    uVar9 = 0x1f;
    if ((uint)uVar28 != 0) {
      for (; (uint)uVar28 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar7 = 0x1e - (uVar9 ^ 0x1f);
    uVar22 = (ulong)((uVar28 >> ((ulong)uVar7 & 0x3f) & 1) != 0);
    uVar19 = ((uVar9 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar22;
    uVar11 = *storage_ix;
    bVar3 = s->cmd_depth[uVar19 + 0x50];
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)*(ushort *)((long)s->cmd_histo + uVar19 * 2 + -0x60) << ((byte)uVar11 & 7) |
         (ulong)storage[uVar11 >> 3];
    uVar11 = bVar3 + uVar11;
    *storage_ix = uVar11;
    *(ulong *)(storage + (uVar11 >> 3)) =
         uVar28 - (uVar22 + 2 << ((byte)uVar7 & 0x3f)) << ((byte)uVar11 & 7) |
         (ulong)storage[uVar11 >> 3];
    uVar11 = uVar11 + uVar7;
    puVar12 = __dest + uVar19 + 0x50;
    local_108 = uVar14 & 0xffffffff;
  }
  *puVar12 = *puVar12 + 1;
  *storage_ix = uVar11;
  bVar3 = (byte)uVar11;
  if (uVar27 < 0xc) {
    bVar4 = *(byte *)((long)s + lVar16 + 0x301);
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)*(ushort *)((long)s + lVar16 * 2 + 0x382) << (bVar3 & 7) |
         (ulong)storage[uVar11 >> 3];
    *storage_ix = bVar4 + uVar11;
    puVar12 = __dest + lVar16 + 1;
  }
  else if (uVar27 < 0x48) {
    uVar28 = lVar16 - 3;
    uVar9 = 0x1f;
    if ((uint)uVar28 != 0) {
      for (; (uint)uVar28 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
    uVar14 = uVar28 >> ((byte)uVar9 & 0x3f);
    lVar21 = uVar14 + (ulong)uVar9 * 2;
    bVar4 = *(byte *)((long)s->cmd_bits + lVar21 + -0x7c);
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)s->cmd_bits[lVar21 + 4] << (bVar3 & 7) | (ulong)storage[uVar11 >> 3];
    uVar11 = bVar4 + uVar11;
    *storage_ix = uVar11;
    *(ulong *)(storage + (uVar11 >> 3)) =
         uVar28 - (uVar14 << ((byte)uVar9 & 0x3f)) << ((byte)uVar11 & 7) |
         (ulong)storage[uVar11 >> 3];
    *storage_ix = uVar11 + uVar9;
    puVar12 = __dest + lVar21 + 4;
  }
  else {
    puVar12 = puVar1;
    if (uVar27 < 0x88) {
      uVar14 = lVar16 - 3U >> 5;
      bVar4 = s->cmd_depth[uVar14 + 0x1e];
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)s->cmd_bits[uVar14 + 0x1e] << (bVar3 & 7) | (ulong)storage[uVar11 >> 3];
      uVar28 = uVar11 + bVar4;
      *storage_ix = uVar28;
      *(ulong *)(storage + (uVar28 >> 3)) =
           (ulong)((uint)(lVar16 - 3U) & 0x1f) << ((byte)uVar28 & 7) | (ulong)storage[uVar28 >> 3];
      uVar27 = uVar11 + bVar4 + 5;
      *storage_ix = uVar27;
      bVar3 = s->cmd_depth[0x40];
      *(ulong *)(storage + (uVar27 >> 3)) =
           (ulong)s->cmd_bits[0x40] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
      *storage_ix = bVar3 + uVar28 + 5;
      s->cmd_histo[uVar14 + 0x1e] = s->cmd_histo[uVar14 + 0x1e] + 1;
    }
    else if (uVar27 < 0x848) {
      uVar7 = (int)lVar16 - 0x43;
      uVar9 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      lVar21 = -(ulong)(uVar9 ^ 0x1f) + 0x3b;
      bVar4 = *(byte *)((long)s + -(ulong)(uVar9 ^ 0x1f) + 0x33b);
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)*(ushort *)((long)s + lVar21 * 2 + 0x380) << (bVar3 & 7) |
           (ulong)storage[uVar11 >> 3];
      uVar11 = bVar4 + uVar11;
      *storage_ix = uVar11;
      uVar28 = uVar9 + uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (-1L << ((byte)uVar9 & 0x3f)) + lVar16 + -0x43 << ((byte)uVar11 & 7) |
           (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar28;
      bVar3 = s->cmd_depth[0x40];
      *(ulong *)(storage + (uVar28 >> 3)) =
           (ulong)s->cmd_bits[0x40] << ((byte)uVar28 & 7) | (ulong)storage[uVar28 >> 3];
      *storage_ix = bVar3 + uVar28;
      piVar2 = (int *)((long)s + lVar21 * 4 + 0x480);
      *piVar2 = *piVar2 + 1;
    }
    else {
      bVar4 = s->cmd_depth[0x27];
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)s->cmd_bits[0x27] << (bVar3 & 7) | (ulong)storage[uVar11 >> 3];
      uVar28 = uVar11 + bVar4;
      *storage_ix = uVar28;
      bVar13 = (byte)uVar28 & 7;
      *(ulong *)(storage + (uVar28 >> 3)) = lVar16 + -0x843 << bVar13 | (ulong)storage[uVar28 >> 3];
      uVar14 = bVar4 + uVar11 + 0x18;
      *storage_ix = uVar14;
      bVar3 = s->cmd_depth[0x40];
      uVar14 = uVar14 >> 3;
      *(ulong *)(storage + uVar14) = (ulong)s->cmd_bits[0x40] << bVar13 | (ulong)storage[uVar14];
      *storage_ix = bVar3 + uVar28 + 0x18;
      s->cmd_histo[0x27] = s->cmd_histo[0x27] + 1;
    }
  }
  *puVar12 = *puVar12 + 1;
  local_120 = (long *)((long)plVar30 + lVar16 + 5);
  while( true ) {
    if (puVar15 + (long)plVar29 <= local_120) goto LAB_00358833;
    uVar28 = *(ulong *)((long)local_120 + -3);
    uVar14 = (uVar28 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
    iVar18 = (int)local_120 - iVar8;
    table[uVar28 * 0x1e35a7bd000000 >> 0x35] = iVar18 + -3;
    table[(uVar28 >> 8) * 0x1e35a7bd000000 >> 0x35] = iVar18 + -2;
    table[(uVar28 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = iVar18 + -1;
    iVar5 = table[uVar14];
    table[uVar14] = iVar18;
    puVar24 = input + iVar5;
    plVar30 = local_120;
    if (((int)*local_120 != *(int *)(input + iVar5)) ||
       (*(uint8_t *)((long)local_120 + 4) != puVar24[4])) break;
    puVar20 = (ulong *)(puVar24 + 5);
    puVar10 = (ulong *)((long)local_120 + 5);
    puVar25 = (uint8_t *)((long)data + (-5 - (long)local_120));
    lVar16 = 0;
LAB_003583ba:
    if (puVar25 < (uint8_t *)0x8) {
      for (puVar23 = (uint8_t *)0x0;
          (puVar25 != puVar23 &&
          (*(uint8_t *)((long)puVar20 + (long)puVar23) ==
           *(uint8_t *)((long)puVar10 + (long)puVar23))); puVar23 = puVar23 + 1) {
      }
      lVar16 = (long)puVar23 - lVar16;
    }
    else {
      if (*puVar10 == *puVar20) goto code_r0x003583cb;
      uVar14 = *puVar20 ^ *puVar10;
      uVar28 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
        }
      }
      lVar16 = (uVar28 >> 3 & 0x1fffffff) - lVar16;
    }
    uVar28 = (long)local_120 - (long)puVar24;
    if (0x3fff0 < (long)uVar28) break;
    uVar14 = lVar16 + 5;
    if (uVar14 < 10) {
      bVar3 = s->cmd_depth[lVar16 + 0x13];
      uVar14 = *storage_ix;
      *(ulong *)(storage + (uVar14 >> 3)) =
           (ulong)s->cmd_bits[lVar16 + 0x13] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
      *storage_ix = bVar3 + uVar14;
      puVar12 = __dest + lVar16 + 0x13;
    }
    else if (uVar14 < 0x86) {
      uVar14 = lVar16 - 1;
      uVar9 = 0x1f;
      if ((uint)uVar14 != 0) {
        for (; (uint)uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
      uVar22 = uVar14 >> ((byte)uVar9 & 0x3f);
      lVar21 = uVar22 + (ulong)uVar9 * 2;
      uVar27 = *storage_ix;
      uVar11 = *(byte *)((long)s->cmd_bits + lVar21 + -0x6c) + uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           (ulong)s->cmd_bits[lVar21 + 0x14] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           uVar14 - (uVar22 << ((byte)uVar9 & 0x3f)) << ((byte)uVar11 & 7) |
           (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar11 + uVar9;
      puVar12 = __dest + lVar21 + 0x14;
    }
    else if (uVar14 < 0x846) {
      uVar7 = (int)lVar16 - 0x41;
      uVar9 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      lVar21 = -(ulong)(uVar9 ^ 0x1f) + 0x3b;
      uVar14 = *storage_ix;
      uVar27 = *(byte *)((long)s + -(ulong)(uVar9 ^ 0x1f) + 0x33b) + uVar14;
      *(ulong *)(storage + (uVar14 >> 3)) =
           (ulong)*(ushort *)((long)s + lVar21 * 2 + 0x380) << ((byte)uVar14 & 7) |
           (ulong)storage[uVar14 >> 3];
      *storage_ix = uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           (-1L << ((byte)uVar9 & 0x3f)) + lVar16 + -0x41 << ((byte)uVar27 & 7) |
           (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar9 + uVar27;
      puVar12 = __dest + lVar21;
    }
    else {
      bVar3 = s->cmd_depth[0x27];
      uVar27 = *storage_ix;
      uVar14 = uVar27 + bVar3;
      *(ulong *)(storage + (uVar27 >> 3)) =
           (ulong)s->cmd_bits[0x27] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar14;
      *(ulong *)(storage + (uVar14 >> 3)) =
           lVar16 + -0x841 << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
      *storage_ix = uVar27 + bVar3 + 0x18;
      puVar12 = s->cmd_histo + 0x27;
    }
    *puVar12 = *puVar12 + 1;
    uVar14 = (long)(int)uVar28 + 3;
    uVar9 = 0x1f;
    if ((uint)uVar14 != 0) {
      for (; (uint)uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar7 = 0x1e - (uVar9 ^ 0x1f);
    uVar11 = (ulong)((uVar14 >> ((ulong)uVar7 & 0x3f) & 1) != 0);
    uVar22 = ((uVar9 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar11;
    uVar27 = *storage_ix;
    bVar3 = s->cmd_depth[uVar22 + 0x50];
    *(ulong *)(storage + (uVar27 >> 3)) =
         (ulong)*(ushort *)((long)s->cmd_histo + uVar22 * 2 + -0x60) << ((byte)uVar27 & 7) |
         (ulong)storage[uVar27 >> 3];
    uVar27 = bVar3 + uVar27;
    *storage_ix = uVar27;
    *(ulong *)(storage + (uVar27 >> 3)) =
         uVar14 - (uVar11 + 2 << ((byte)uVar7 & 0x3f)) << ((byte)uVar27 & 7) |
         (ulong)storage[uVar27 >> 3];
    *storage_ix = uVar27 + uVar7;
    s->cmd_histo[uVar22 + 0x50] = s->cmd_histo[uVar22 + 0x50] + 1;
    local_120 = (long *)((long)local_120 + lVar16 + 5);
    local_108 = uVar28 & 0xffffffff;
  }
  goto LAB_00357b56;
code_r0x00357c1f:
  puVar20 = puVar20 + 1;
  puVar10 = puVar10 + 1;
  puVar24 = puVar24 + -8;
  lVar16 = lVar16 + -8;
  goto LAB_00357c0e;
code_r0x003583cb:
  puVar10 = puVar10 + 1;
  puVar20 = puVar20 + 1;
  puVar25 = puVar25 + -8;
  lVar16 = lVar16 + -8;
  goto LAB_003583ba;
LAB_003588a1:
  if (local_120 < data) {
    uVar28 = (long)data - (long)local_120;
    if (uVar28 < 0x1842) {
      if (uVar28 < 6) {
        bVar3 = *(byte *)((long)s + uVar28 + 0x328);
        uVar14 = *storage_ix;
        *(ulong *)(storage + (uVar14 >> 3)) =
             (ulong)*(ushort *)((long)s + uVar28 * 2 + 0x3d0) << ((byte)uVar14 & 7) |
             (ulong)storage[uVar14 >> 3];
        *storage_ix = bVar3 + uVar14;
        puVar12 = __dest + uVar28 + 0x28;
      }
      else if (uVar28 < 0x82) {
        uVar14 = uVar28 - 2;
        uVar9 = 0x1f;
        if ((uint)uVar14 != 0) {
          for (; (uint)uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
        uVar22 = uVar14 >> ((byte)uVar9 & 0x3f);
        lVar16 = uVar22 + (ulong)uVar9 * 2;
        uVar27 = *storage_ix;
        uVar11 = *(byte *)((long)s->cmd_bits + lVar16 + -0x56) + uVar27;
        *(ulong *)(storage + (uVar27 >> 3)) =
             (ulong)s->cmd_bits[lVar16 + 0x2a] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
        *storage_ix = uVar11;
        *(ulong *)(storage + (uVar11 >> 3)) =
             uVar14 - (uVar22 << ((byte)uVar9 & 0x3f)) << ((byte)uVar11 & 7) |
             (ulong)storage[uVar11 >> 3];
        *storage_ix = uVar11 + uVar9;
        puVar12 = __dest + lVar16 + 0x2a;
      }
      else if (uVar28 < 0x842) {
        uVar7 = (int)uVar28 - 0x42;
        uVar9 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        lVar16 = -(ulong)(uVar9 ^ 0x1f) + 0x51;
        uVar14 = *storage_ix;
        uVar27 = *(byte *)((long)s + -(ulong)(uVar9 ^ 0x1f) + 0x351) + uVar14;
        *(ulong *)(storage + (uVar14 >> 3)) =
             (ulong)*(ushort *)((long)s + lVar16 * 2 + 0x380) << ((byte)uVar14 & 7) |
             (ulong)storage[uVar14 >> 3];
        *storage_ix = uVar27;
        *(ulong *)(storage + (uVar27 >> 3)) =
             (-1L << ((byte)uVar9 & 0x3f)) + uVar28 + -0x42 << ((byte)uVar27 & 7) |
             (ulong)storage[uVar27 >> 3];
        *storage_ix = uVar9 + uVar27;
        puVar12 = __dest + lVar16;
      }
      else {
        bVar3 = s->cmd_depth[0x3d];
        uVar27 = *storage_ix;
        uVar14 = uVar27 + bVar3;
        *(ulong *)(storage + (uVar27 >> 3)) =
             (ulong)s->cmd_bits[0x3d] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
        *storage_ix = uVar14;
        *(ulong *)(storage + (uVar14 >> 3)) =
             uVar28 - 0x842 << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
        *storage_ix = bVar3 + uVar27 + 0xc;
        puVar12 = s->cmd_histo + 0x3d;
      }
      *puVar12 = *puVar12 + 1;
      for (uVar14 = 0; uVar28 != uVar14; uVar14 = uVar14 + 1) {
        bVar3 = s->lit_depth[*(byte *)((long)local_120 + uVar14)];
        uVar27 = *storage_ix;
        *(ulong *)(storage + (uVar27 >> 3)) =
             (ulong)s->lit_bits[*(byte *)((long)local_120 + uVar14)] << ((byte)uVar27 & 7) |
             (ulong)storage[uVar27 >> 3];
        *storage_ix = bVar3 + uVar27;
      }
    }
    else {
      uVar14 = ((long)local_120 - (long)begin) * 0x32;
      if ((uVar14 < uVar28 || uVar14 - uVar28 == 0) && (0x3d4 < local_e0)) {
        EmitUncompressedMetaBlock((uint8_t *)begin,(uint8_t *)data,local_f8,storage_ix,storage);
      }
      else {
        bVar31 = uVar28 < 0x5842;
        puVar12 = s->cmd_histo + 0x3f;
        puVar6 = s->cmd_bits + 0x3f;
        puVar17 = s->cmd_depth + 0x3f;
        if (bVar31) {
          puVar12 = s->cmd_histo + 0x3e;
          puVar6 = s->cmd_bits + 0x3e;
          puVar17 = s->cmd_depth + 0x3e;
        }
        bVar3 = *puVar17;
        uVar14 = *storage_ix;
        lVar16 = uVar14 + 0x18;
        if (bVar31) {
          lVar16 = uVar14 + 0xe;
        }
        uVar27 = lVar16 + (ulong)bVar3;
        *(ulong *)(storage + (uVar14 >> 3)) =
             (ulong)*puVar6 << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
        uVar14 = uVar14 + bVar3;
        *storage_ix = uVar14;
        *(ulong *)(storage + (uVar14 >> 3)) =
             ((ulong)bVar31 << 0xe | 0xffffffffffffa7be) + uVar28 << ((byte)uVar14 & 7) |
             (ulong)storage[uVar14 >> 3];
        *puVar12 = *puVar12 + 1;
        *storage_ix = uVar27;
        for (uVar14 = 0; uVar28 != uVar14; uVar14 = uVar14 + 1) {
          bVar3 = s->lit_depth[*(byte *)((long)local_120 + uVar14)];
          *(ulong *)(storage + (uVar27 >> 3)) =
               (ulong)s->lit_bits[*(byte *)((long)local_120 + uVar14)] << ((byte)uVar27 & 7) |
               (ulong)storage[uVar27 >> 3];
          uVar27 = uVar27 + bVar3;
          *storage_ix = uVar27;
        }
      }
    }
  }
LAB_00358c76:
  if (local_118 == (uint8_t *)0x0) {
    if (is_last == 0) {
      s->cmd_code[0] = '\0';
      s->cmd_code_numbits = 0;
      BuildAndStoreCommandPrefixCode(s,&s->cmd_code_numbits,s->cmd_code);
      return;
    }
    return;
  }
  puVar17 = (uint8_t *)0x18000;
  if (local_118 < (uint8_t *)0x18000) {
    puVar17 = local_118;
  }
  local_f8 = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)puVar17,0,storage_ix,storage);
  uVar28 = *storage_ix;
  uVar14 = uVar28 >> 3;
  *(ulong *)(storage + uVar14) = (ulong)storage[uVar14];
  *storage_ix = uVar28 + 0xd;
  local_e0 = BuildAndStoreLiteralPrefixCode
                       (s,(uint8_t *)data,(size_t)puVar17,s->lit_depth,s->lit_bits,storage_ix,
                        storage);
  BuildAndStoreCommandPrefixCode(s,storage_ix,storage);
  begin = data;
  goto LAB_00357aba;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentFast(
    BrotliOnePassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          s, input, input_size, is_last, table, storage_ix, storage);\
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}